

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.c
# Opt level: O0

int mbedtls_chacha20_setkey(mbedtls_chacha20_context *ctx,uchar *key)

{
  uchar *key_local;
  mbedtls_chacha20_context *ctx_local;
  
  ctx->state[0] = 0x61707865;
  ctx->state[1] = 0x3320646e;
  ctx->state[2] = 0x79622d32;
  ctx->state[3] = 0x6b206574;
  ctx->state[4] = *(uint32_t *)key;
  ctx->state[5] = *(uint32_t *)(key + 4);
  ctx->state[6] = *(uint32_t *)(key + 8);
  ctx->state[7] = *(uint32_t *)(key + 0xc);
  ctx->state[8] = *(uint32_t *)(key + 0x10);
  ctx->state[9] = *(uint32_t *)(key + 0x14);
  ctx->state[10] = *(uint32_t *)(key + 0x18);
  ctx->state[0xb] = *(uint32_t *)(key + 0x1c);
  return 0;
}

Assistant:

int mbedtls_chacha20_setkey( mbedtls_chacha20_context *ctx,
                            const unsigned char key[32] )
{
    CHACHA20_VALIDATE_RET( ctx != NULL );
    CHACHA20_VALIDATE_RET( key != NULL );

    /* ChaCha20 constants - the string "expand 32-byte k" */
    ctx->state[0] = 0x61707865;
    ctx->state[1] = 0x3320646e;
    ctx->state[2] = 0x79622d32;
    ctx->state[3] = 0x6b206574;

    /* Set key */
    ctx->state[4]  = BYTES_TO_U32_LE( key, 0 );
    ctx->state[5]  = BYTES_TO_U32_LE( key, 4 );
    ctx->state[6]  = BYTES_TO_U32_LE( key, 8 );
    ctx->state[7]  = BYTES_TO_U32_LE( key, 12 );
    ctx->state[8]  = BYTES_TO_U32_LE( key, 16 );
    ctx->state[9]  = BYTES_TO_U32_LE( key, 20 );
    ctx->state[10] = BYTES_TO_U32_LE( key, 24 );
    ctx->state[11] = BYTES_TO_U32_LE( key, 28 );

    return( 0 );
}